

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

FieldDescriptorProto * __thiscall
google::protobuf::FieldDescriptorProto::New(FieldDescriptorProto *this,Arena *arena)

{
  FieldDescriptorProto *this_00;
  
  this_00 = (FieldDescriptorProto *)operator_new(0x58);
  FieldDescriptorProto(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::FieldDescriptorProto>(arena,this_00);
  }
  return this_00;
}

Assistant:

FieldDescriptorProto* FieldDescriptorProto::New(::google::protobuf::Arena* arena) const {
  FieldDescriptorProto* n = new FieldDescriptorProto;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}